

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  uint8_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint8_t uVar14;
  int iVar15;
  int iVar16;
  byte bVar17;
  byte *pbVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t byte;
  uint uVar24;
  char local_88 [14];
  char cStack_7a;
  int local_78 [12];
  byte local_48;
  undefined3 uStack_47;
  rar_filter *local_40;
  uint local_34;
  
  uVar4 = filter->prog->fingerprint;
  if ((long)uVar4 < 0x393cd7e57e) {
    if (uVar4 != 0x1d0e06077d) {
      if (uVar4 != 0x35ad576887) {
LAB_00144849:
        archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
        return 0;
      }
      iVar9 = 0;
      goto LAB_001446f2;
    }
    uVar2 = filter->initialregisters[4];
    if (0x1e000 < (ulong)uVar2) {
      return 0;
    }
    uVar3 = filter->initialregisters[0];
    if (uVar3 != 0) {
      puVar8 = vm->memory;
      uVar24 = 0;
      do {
        if (uVar24 < uVar2) {
          uVar14 = '\0';
          uVar13 = uVar24;
          do {
            if (vm->memory + uVar2 <= puVar8) {
              return 0;
            }
            uVar1 = *puVar8;
            puVar8 = puVar8 + 1;
            uVar14 = uVar14 - uVar1;
            (vm->memory + uVar2)[uVar13] = uVar14;
            uVar13 = uVar13 + uVar3;
          } while (uVar13 < uVar2);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar3);
    }
    filter->filteredblockaddress = uVar2;
    filter->filteredblocklength = uVar2;
  }
  else {
    if (uVar4 == 0x393cd7e57e) {
      iVar9 = 1;
LAB_001446f2:
      iVar9 = execute_filter_e8(filter,vm,pos,iVar9);
      return iVar9;
    }
    if (uVar4 == 0x951c2c5dc8) {
      uVar2 = filter->initialregisters[4];
      uVar6 = (ulong)uVar2;
      if (0x1e000 < uVar6) {
        return 0;
      }
      uVar24 = filter->initialregisters[1];
      uVar11 = (ulong)uVar24;
      if ((2 < uVar24 || uVar2 < 3) || uVar2 < filter->initialregisters[0]) {
        return 0;
      }
      puVar8 = vm->memory;
      lVar5 = uVar6 - filter->initialregisters[0];
      uVar23 = 0;
      do {
        bVar17 = 0;
        uVar22 = uVar23;
        do {
          if (vm->memory + uVar6 <= puVar8) {
            return 0;
          }
          pbVar18 = (byte *)((long)vm + uVar22 + lVar5 + 0x20);
          if (vm->memory + uVar6 <= pbVar18) {
            uVar7 = (uint)*(byte *)((long)vm + uVar22 + lVar5 + 0x20);
            uVar19 = *(byte *)((long)vm + uVar22 + lVar5 + 0x23) - uVar7;
            uVar13 = -uVar19;
            if (0 < (int)uVar19) {
              uVar13 = uVar19;
            }
            uVar7 = bVar17 - uVar7;
            uVar20 = -uVar7;
            if (0 < (int)uVar7) {
              uVar20 = uVar7;
            }
            uVar7 = uVar7 + uVar19;
            uVar19 = -uVar7;
            if (0 < (int)uVar7) {
              uVar19 = uVar7;
            }
            if (((uVar20 & 0xff) < (uVar13 & 0xff)) || (uVar19 < (uVar13 & 0xff))) {
              if ((uVar20 & 0xff) <= uVar19) {
                pbVar18 = (byte *)((long)vm + uVar22 + lVar5 + 0x23);
              }
              bVar17 = *pbVar18;
            }
          }
          bVar17 = bVar17 - *puVar8;
          puVar8 = puVar8 + 1;
          vm->memory[uVar22 + uVar6] = bVar17;
          uVar22 = uVar22 + 3;
        } while (uVar22 < uVar6);
        uVar23 = uVar23 + 1;
      } while (uVar23 != 3);
      if (uVar24 < uVar2 - 2) {
        do {
          uVar14 = vm->memory[uVar11 + uVar6 + 1];
          vm->memory[uVar11 + uVar6] = vm->memory[uVar11 + uVar6] + uVar14;
          vm->memory[uVar11 + uVar6 + 2] = vm->memory[uVar11 + uVar6 + 2] + uVar14;
          uVar11 = uVar11 + 3;
        } while (uVar11 < uVar2 - 2);
      }
      filter->filteredblockaddress = uVar2;
      filter->filteredblocklength = uVar2;
    }
    else {
      if (uVar4 != 0xd8bc85e701) goto LAB_00144849;
      uVar2 = filter->initialregisters[4];
      if (0x1e000 < (ulong)uVar2) {
        return 0;
      }
      local_40 = filter;
      uVar3 = filter->initialregisters[0];
      if (uVar3 != 0) {
        puVar8 = vm->memory;
        local_34 = 0;
        do {
          local_78[8] = 0;
          local_78[9] = 0;
          local_78[10] = 0;
          local_78[0xb] = 0;
          local_78[4] = 0;
          local_78[5] = 0;
          local_78[6] = 0;
          local_78[7] = 0;
          local_78[0] = 0;
          local_78[1] = 0;
          local_78[2] = 0;
          local_78[3] = 0;
          if (local_34 < uVar2) {
            local_88[0] = '\0';
            local_88[1] = '\0';
            cStack_7a = '\0';
            local_48 = 0;
            local_88[2] = '\0';
            uVar24 = local_34;
            uVar13 = local_78[0xb];
            uVar7 = 0;
            iVar9 = 0;
            do {
              if (vm->memory + uVar2 <= puVar8) {
                return 0;
              }
              iVar12 = (int)(char)*puVar8;
              iVar21 = (int)cStack_7a;
              uVar19 = iVar21 - iVar9;
              bVar17 = (char)((int)local_88[2] * (uVar7 & 0xffff) + (uint)local_48 * 8 +
                              (int)local_88[1] * uVar19 + local_88[0] * iVar21 >> 3) - *puVar8;
              iVar9 = iVar12 * 8;
              iVar16 = iVar12 * -8;
              if (iVar12 * -8 < 0) {
                iVar16 = iVar9;
              }
              iVar10 = iVar9 - iVar21;
              iVar15 = -iVar10;
              if (0 < iVar10) {
                iVar15 = iVar10;
              }
              local_78[1] = local_78[1] + iVar15;
              local_78[0] = local_78[0] + iVar16;
              iVar16 = iVar21 + iVar12 * 8;
              iVar15 = -iVar16;
              if (0 < iVar16) {
                iVar15 = iVar16;
              }
              iVar10 = iVar9 - (short)uVar19;
              iVar16 = -iVar10;
              if (0 < iVar10) {
                iVar16 = iVar10;
              }
              local_78[3] = local_78[3] + iVar16;
              local_78[2] = local_78[2] + iVar15;
              iVar16 = (int)(short)uVar19 + iVar12 * 8;
              iVar15 = -iVar16;
              if (0 < iVar16) {
                iVar15 = iVar16;
              }
              iVar9 = iVar9 - (short)uVar7;
              iVar16 = -iVar9;
              if (0 < iVar9) {
                iVar16 = iVar9;
              }
              local_78[5] = local_78[5] + iVar16;
              local_78[4] = local_78[4] + iVar15;
              iVar9 = (int)(short)uVar7 + iVar12 * 8;
              iVar16 = -iVar9;
              if (0 < iVar9) {
                iVar16 = iVar9;
              }
              local_78[6] = local_78[6] + iVar16;
              cStack_7a = bVar17 - local_48;
              local_48 = bVar17;
              uStack_47 = 0;
              (vm->memory + uVar2)[uVar24] = bVar17;
              local_78[0xb] = uVar13 + 1;
              if ((uVar13 & 0x1f) == 0) {
                lVar5 = 5;
                uVar6 = 0;
                do {
                  if (*(int *)(local_88 + lVar5 * 4) < local_78[uVar6]) {
                    uVar6 = (ulong)((int)lVar5 - 4U & 0xff);
                  }
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 0xb);
                local_78[8] = 0;
                local_78[9] = 0;
                local_78[10] = 0;
                local_78[4] = 0;
                local_78[5] = 0;
                local_78[6] = 0;
                local_78[7] = 0;
                local_78[0] = 0;
                local_78[1] = 0;
                local_78[2] = 0;
                local_78[3] = 0;
                switch((int)uVar6) {
                case 1:
                  if (-0x11 < local_88[0]) {
                    local_88[0] = local_88[0] + -1;
                  }
                  break;
                case 2:
                  if (local_88[0] < '\x10') {
                    local_88[0] = local_88[0] + '\x01';
                  }
                  break;
                case 3:
                  if (-0x11 < local_88[1]) {
                    local_88[1] = local_88[1] + -1;
                  }
                  break;
                case 4:
                  if (local_88[1] < '\x10') {
                    local_88[1] = local_88[1] + '\x01';
                  }
                  break;
                case 5:
                  if (-0x11 < local_88[2]) {
                    local_88[2] = local_88[2] + -1;
                  }
                  break;
                case 6:
                  if (local_88[2] < '\x10') {
                    local_88[2] = local_88[2] + '\x01';
                  }
                }
              }
              puVar8 = puVar8 + 1;
              uVar24 = uVar24 + uVar3;
              uVar13 = uVar13 + 1;
              uVar7 = uVar19;
              iVar9 = iVar21;
            } while (uVar24 < uVar2);
          }
          local_34 = local_34 + 1;
        } while (local_34 != uVar3);
      }
      filter->filteredblockaddress = uVar2;
      filter->filteredblocklength = uVar2;
    }
  }
  return 1;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}